

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void free_D_ParseNode(D_Parser *p,D_ParseNode *dpn)

{
  int iVar1;
  PNode *local_30;
  D_ParseNode *local_20;
  D_ParseNode *dpn_local;
  D_Parser *p_local;
  
  if (dpn != (D_ParseNode *)0x1) {
    if (dpn == (D_ParseNode *)0x0) {
      local_20 = (D_ParseNode *)0x0;
    }
    else {
      local_20 = dpn + -2;
    }
    iVar1 = *(int *)((long)&(local_20->start_loc).pathname + 4) + -1;
    *(int *)((long)&(local_20->start_loc).pathname + 4) = iVar1;
    if (iVar1 == 0) {
      if (dpn == (D_ParseNode *)0x0) {
        local_30 = (PNode *)0x0;
      }
      else {
        local_30 = (PNode *)(dpn + -2);
      }
      free_PNode((Parser *)p,local_30);
    }
    free_parser_working_data((Parser *)p);
  }
  return;
}

Assistant:

void free_D_ParseNode(D_Parser *p, D_ParseNode *dpn) {
  if (dpn != NO_DPN) {
    unref_pn((Parser *)p, DPN_TO_PN(dpn));
    free_parser_working_data((Parser *)p);
  }
#ifdef TRACK_PNODES
  if (((Parser *)p)->xall) printf("tracked pnodes\n");
#endif
}